

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void xmlParseEndTag2(xmlParserCtxtPtr ctxt,xmlStartTag *tag)

{
  xmlChar xVar1;
  byte bVar2;
  xmlChar *pxVar3;
  xmlChar *pxVar4;
  endElementNsSAX2Func p_Var5;
  xmlParserInputPtr pxVar6;
  long lVar7;
  byte *pbVar8;
  byte *pbVar9;
  xmlHashedString xVar10;
  byte *pbStack_40;
  xmlHashedString p;
  
  pxVar6 = ctxt->input;
  if (((pxVar6->flags & 0x40) == 0) && ((long)pxVar6->end - (long)pxVar6->cur < 0xfa)) {
    xmlParserGrow(ctxt);
    pxVar6 = ctxt->input;
  }
  pxVar3 = pxVar6->cur;
  if ((*pxVar3 != '<') || (pxVar3[1] != '/')) {
    xmlFatalErr(ctxt,XML_ERR_LTSLASH_REQUIRED,(char *)0x0);
    return;
  }
  pxVar6->cur = pxVar3 + 2;
  pxVar6->col = pxVar6->col + 2;
  if (pxVar3[2] == '\0') {
    xmlParserGrow(ctxt);
  }
  pxVar3 = tag->prefix;
  pbVar9 = ctxt->name;
  if (pxVar3 == (xmlChar *)0x0) {
    pbStack_40 = xmlParseNameAndCompare(ctxt,pbVar9);
    goto LAB_0013ea23;
  }
  pxVar6 = ctxt->input;
  if (((pxVar6->flags & 0x40) == 0) && ((long)pxVar6->end - (long)pxVar6->cur < 0xfa)) {
    xmlParserGrow(ctxt);
    pxVar6 = ctxt->input;
  }
  pxVar4 = pxVar6->cur;
  for (lVar7 = 1; xVar1 = pxVar4[lVar7 + -1], xVar1 != '\0'; lVar7 = lVar7 + 1) {
    if (xVar1 != pxVar3[lVar7 + -1]) {
      if ((xVar1 == ':') && (pbVar8 = pbVar9, pxVar3[lVar7 + -1] == '\0')) goto LAB_0013e9d8;
      break;
    }
  }
LAB_0013e9f9:
  xVar10 = xmlParseQNameHashed(ctxt,&p);
  pbVar8 = xVar10.name;
  if (pbVar8 == (byte *)0x0) {
    pbStack_40 = (byte *)0x0;
  }
  else {
    pbStack_40 = (byte *)0x1;
    if (pxVar3 != p.name || pbVar9 != pbVar8) {
      pbStack_40 = pbVar8;
    }
  }
LAB_0013ea23:
  pxVar6 = ctxt->input;
  if (((pxVar6->flags & 0x40) == 0) && ((long)pxVar6->end - (long)pxVar6->cur < 0xfa)) {
    xmlParserGrow(ctxt);
  }
  xmlSkipBlankChars(ctxt);
  pxVar6 = ctxt->input;
  pxVar3 = pxVar6->cur;
  if (*pxVar3 == '>') {
    pxVar6->col = pxVar6->col + 1;
    pxVar6->cur = pxVar3 + 1;
    if (pxVar3[1] == '\0') {
      xmlParserGrow(ctxt);
    }
  }
  else {
    xmlFatalErr(ctxt,XML_ERR_GT_REQUIRED,(char *)0x0);
  }
  if (pbStack_40 != (byte *)0x1) {
    pbVar9 = (byte *)"unparsable";
    if (pbStack_40 != (byte *)0x0) {
      pbVar9 = pbStack_40;
    }
    xmlFatalErrMsgStrIntStr
              (ctxt,XML_ERR_TAG_NAME_MISMATCH,"Opening and ending tag mismatch: %s line %d and %s\n"
               ,ctxt->name,tag->line,pbVar9);
  }
  if (((ctxt->sax != (_xmlSAXHandler *)0x0) &&
      (p_Var5 = ctxt->sax->endElementNs, p_Var5 != (endElementNsSAX2Func)0x0)) &&
     (ctxt->disableSAX == 0)) {
    (*p_Var5)(ctxt->userData,ctxt->name,tag->prefix,tag->URI);
  }
  spacePop(ctxt);
  if (tag->nsNr == 0) {
    return;
  }
  xmlParserNsPop(ctxt,tag->nsNr);
  return;
LAB_0013e9d8:
  while( true ) {
    bVar2 = pxVar4[lVar7];
    if ((bVar2 == 0) || (bVar2 != *pbVar8)) break;
    lVar7 = lVar7 + 1;
    pbVar8 = pbVar8 + 1;
  }
  if (((*pbVar8 == 0) && (bVar2 < 0x3f)) &&
     ((0x4000000100002600U >> ((ulong)(uint)bVar2 & 0x3f) & 1) != 0)) {
    pxVar6->col = pxVar6->col + (int)lVar7;
    pxVar6->cur = pxVar4 + lVar7;
    pbStack_40 = (byte *)0x1;
    goto LAB_0013ea23;
  }
  goto LAB_0013e9f9;
}

Assistant:

static void
xmlParseEndTag2(xmlParserCtxtPtr ctxt, const xmlStartTag *tag) {
    const xmlChar *name;

    GROW;
    if ((RAW != '<') || (NXT(1) != '/')) {
	xmlFatalErr(ctxt, XML_ERR_LTSLASH_REQUIRED, NULL);
	return;
    }
    SKIP(2);

    if (tag->prefix == NULL)
        name = xmlParseNameAndCompare(ctxt, ctxt->name);
    else
        name = xmlParseQNameAndCompare(ctxt, ctxt->name, tag->prefix);

    /*
     * We should definitely be at the ending "S? '>'" part
     */
    GROW;
    SKIP_BLANKS;
    if ((!IS_BYTE_CHAR(RAW)) || (RAW != '>')) {
	xmlFatalErr(ctxt, XML_ERR_GT_REQUIRED, NULL);
    } else
	NEXT1;

    /*
     * [ WFC: Element Type Match ]
     * The Name in an element's end-tag must match the element type in the
     * start-tag.
     *
     */
    if (name != (xmlChar*)1) {
        if (name == NULL) name = BAD_CAST "unparsable";
        xmlFatalErrMsgStrIntStr(ctxt, XML_ERR_TAG_NAME_MISMATCH,
		     "Opening and ending tag mismatch: %s line %d and %s\n",
		                ctxt->name, tag->line, name);
    }

    /*
     * SAX: End of Tag
     */
    if ((ctxt->sax != NULL) && (ctxt->sax->endElementNs != NULL) &&
	(!ctxt->disableSAX))
	ctxt->sax->endElementNs(ctxt->userData, ctxt->name, tag->prefix,
                                tag->URI);

    spacePop(ctxt);
    if (tag->nsNr != 0)
	xmlParserNsPop(ctxt, tag->nsNr);
}